

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O2

void __thiscall
io::net::dynamic_string_buffer<char,_std::char_traits<char>,_std::allocator<char>_>::consume
          (dynamic_string_buffer<char,_std::char_traits<char>,_std::allocator<char>_> *this,size_t n
          )

{
  if (this->size_ < n) {
    n = this->size_;
  }
  std::__cxx11::string::erase((ulong)this->str_,n);
  this->size_ = this->size_ - n;
  return;
}

Assistant:

void consume(std::size_t n)
    {
        std::size_t m = std::min(n, size_);
        str_.erase(m);
        size_ -= m;
    }